

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall TestRuns::Run(TestRuns *this)

{
  char cVar1;
  string *this_00;
  Results rs;
  Results rs_1;
  TestRunsInternal myTestA;
  TestRegistry r;
  allocator local_14f1;
  string local_14f0;
  string local_14d0;
  RunParams local_14b0;
  Test local_1498;
  TestRegistry local_1458;
  
  testinator::TestRegistry::TestRegistry(&local_1458);
  std::__cxx11::string::string((string *)&local_14f0,"A",(allocator *)&local_14b0);
  std::__cxx11::string::string((string *)&local_14d0,"B",&local_14f1);
  TestRunsInternal::TestRunsInternal
            ((TestRunsInternal *)&local_1498,&local_1458,&local_14f0,&local_14d0);
  std::__cxx11::string::~string((string *)&local_14d0);
  std::__cxx11::string::~string((string *)&local_14f0);
  local_14d0._M_dataplus._M_p = (pointer)0x0;
  local_14d0._M_string_length = 100;
  local_14d0.field_2._M_allocated_capacity = 0;
  testinator::TestRegistry::RunAllTests
            ((Results *)&local_14f0,&local_1458,(RunParams *)&local_14d0,(Outputter *)0x0);
  if (local_14f0._M_dataplus._M_p == (pointer)local_14f0._M_string_length) {
    this_00 = &local_14f0;
  }
  else {
    cVar1 = local_14f0._M_dataplus._M_p[0x40];
    std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
              ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)&local_14f0);
    testinator::Test::~Test(&local_1498);
    testinator::TestRegistry::~TestRegistry(&local_1458);
    if (cVar1 == '\0') {
      return false;
    }
    testinator::TestRegistry::TestRegistry(&local_1458);
    std::__cxx11::string::string((string *)&local_14f0,"A",(allocator *)&local_14b0);
    std::__cxx11::string::string((string *)&local_14d0,"B",&local_14f1);
    TestRunsInternal::TestRunsInternal
              ((TestRunsInternal *)&local_1498,&local_1458,&local_14f0,&local_14d0);
    std::__cxx11::string::~string((string *)&local_14d0);
    std::__cxx11::string::~string((string *)&local_14f0);
    std::__cxx11::string::string((string *)&local_14f0,"A",&local_14f1);
    local_14b0.m_flags = 0;
    local_14b0._4_4_ = 0;
    local_14b0.m_numPropertyChecks = 100;
    local_14b0.m_randomSeed = 0;
    testinator::TestRegistry::RunTest
              ((Results *)&local_14d0,&local_1458,&local_14f0,&local_14b0,(Outputter *)0x0);
    std::__cxx11::string::~string((string *)&local_14f0);
    if (local_14d0._M_dataplus._M_p != (pointer)local_14d0._M_string_length) {
      cVar1 = local_14d0._M_dataplus._M_p[0x40];
      std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
                ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)&local_14d0);
      testinator::Test::~Test(&local_1498);
      testinator::TestRegistry::~TestRegistry(&local_1458);
      if (cVar1 == '\0') {
        return false;
      }
      testinator::TestRegistry::TestRegistry(&local_1458);
      std::__cxx11::string::string((string *)&local_14f0,"A",(allocator *)&local_14b0);
      std::__cxx11::string::string((string *)&local_14d0,"B",&local_14f1);
      TestRunsInternal::TestRunsInternal
                ((TestRunsInternal *)&local_1498,&local_1458,&local_14f0,&local_14d0);
      std::__cxx11::string::~string((string *)&local_14d0);
      std::__cxx11::string::~string((string *)&local_14f0);
      std::__cxx11::string::string((string *)&local_14f0,"B",&local_14f1);
      local_14b0.m_flags = 0;
      local_14b0._4_4_ = 0;
      local_14b0.m_numPropertyChecks = 100;
      local_14b0.m_randomSeed = 0;
      testinator::TestRegistry::RunSuite
                ((Results *)&local_14d0,&local_1458,&local_14f0,&local_14b0,(Outputter *)0x0);
      std::__cxx11::string::~string((string *)&local_14f0);
      if (local_14d0._M_dataplus._M_p == (pointer)local_14d0._M_string_length) {
        cVar1 = '\0';
      }
      else {
        cVar1 = local_14d0._M_dataplus._M_p[0x40];
      }
      std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
                ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)&local_14d0);
      testinator::Test::~Test(&local_1498);
      testinator::TestRegistry::~TestRegistry(&local_1458);
      return (bool)cVar1;
    }
    this_00 = &local_14d0;
  }
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)this_00);
  testinator::Test::~Test(&local_1498);
  testinator::TestRegistry::~TestRegistry(&local_1458);
  return false;
}

Assistant:

virtual bool Run()
  {
    {
      testinator::TestRegistry r;
      TestRunsInternal myTestA(r, "A", "B");
      testinator::Results rs = r.RunAllTests();
      if (rs.empty() || !rs.front().m_success)
        return false;
    }
    {
      testinator::TestRegistry r;
      TestRunsInternal myTestA(r, "A", "B");
      testinator::Results rs = r.RunTest("A");
      if (rs.empty() || !rs.front().m_success)
        return false;
    }
    {
      testinator::TestRegistry r;
      TestRunsInternal myTestA(r, "A", "B");
      testinator::Results rs = r.RunSuite("B");
      if (rs.empty() || !rs.front().m_success)
        return false;
    }
    return true;
  }